

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_sse4.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_2d_copy_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               ConvolveParams *conv_params,int bd)

{
  int iVar1;
  uint16_t *puVar2;
  short sVar3;
  short sVar4;
  char cVar5;
  uint uVar6;
  uint16_t *puVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint16_t *puVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  uint16_t *puVar17;
  uint16_t *puVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  uint16_t *puVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  undefined1 auVar28 [16];
  short sVar29;
  int iVar30;
  int iVar35;
  int iVar36;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar37;
  undefined1 auVar34 [16];
  short sVar38;
  int iVar39;
  int iVar46;
  int iVar47;
  undefined1 in_XMM9 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM11 [16];
  
  iVar10 = conv_params->round_0 + conv_params->round_1;
  cVar5 = (char)bd - (char)iVar10;
  uVar8 = 0xe - iVar10;
  uVar21 = (1 << (cVar5 + 0xdU & 0x1f)) + (1 << (cVar5 + 0xeU & 0x1f));
  auVar23 = ZEXT416(uVar8);
  uVar9 = 0xff;
  if (bd == 0xc) {
    uVar9 = 0xfff;
  }
  puVar2 = conv_params->dst;
  uVar6 = 0x3ff;
  if (bd != 10) {
    uVar6 = uVar9;
  }
  lVar11 = (long)conv_params->dst_stride;
  iVar10 = conv_params->do_average;
  iVar27 = conv_params->fwd_offset;
  iVar30 = conv_params->bck_offset;
  iVar1 = conv_params->use_dist_wtd_comp_avg;
  auVar24._4_4_ = iVar27;
  auVar24._0_4_ = iVar27;
  auVar24._8_4_ = iVar27;
  auVar24._12_4_ = iVar27;
  auVar25._4_4_ = iVar30;
  auVar25._0_4_ = iVar30;
  auVar25._8_4_ = iVar30;
  auVar25._12_4_ = iVar30;
  auVar26 = pshuflw(ZEXT416(uVar21),ZEXT416(uVar21),0);
  auVar26._4_4_ = auVar26._0_4_;
  auVar26._8_4_ = auVar26._0_4_;
  auVar26._12_4_ = auVar26._0_4_;
  iVar27 = (1 << ((byte)uVar8 & 0x1f)) >> 1;
  auVar28 = pshuflw(ZEXT416(uVar6),ZEXT416(uVar6),0);
  sVar3 = auVar28._0_2_;
  sVar4 = auVar28._2_2_;
  if ((w & 7U) == 0) {
    uVar20 = 0;
    puVar17 = puVar2;
    uVar15 = (ulong)(uint)h;
    if (h < 1) {
      uVar15 = uVar20;
    }
    for (; uVar20 != uVar15; uVar20 = uVar20 + 1) {
      for (lVar13 = 0; lVar13 < w; lVar13 = lVar13 + 8) {
        auVar28 = psllw(*(undefined1 (*) [16])(src + lVar13),auVar23);
        if (iVar10 == 0) {
          in_XMM9 = paddusw(auVar28,auVar26);
          puVar7 = puVar2 + uVar20 * lVar11;
        }
        else {
          auVar32 = *(undefined1 (*) [16])(puVar17 + lVar13);
          in_XMM11 = pmovzxwd(in_XMM11,auVar32);
          auVar49._0_4_ = CONCAT22(0,auVar32._8_2_);
          auVar49._4_2_ = auVar32._10_2_;
          auVar49._6_2_ = 0;
          auVar49._8_2_ = auVar32._12_2_;
          auVar49._10_2_ = 0;
          auVar49._12_2_ = auVar32._14_2_;
          auVar49._14_2_ = 0;
          auVar40 = pmovzxwd(in_XMM9,auVar28);
          auVar41._0_4_ = auVar40._0_4_ + uVar21;
          auVar41._4_4_ = auVar40._4_4_ + uVar21;
          auVar41._8_4_ = auVar40._8_4_ + uVar21;
          auVar41._12_4_ = auVar40._12_4_ + uVar21;
          if (iVar1 == 0) {
            iVar39 = auVar41._0_4_ + in_XMM11._0_4_ >> 1;
            iVar46 = auVar41._4_4_ + in_XMM11._4_4_ >> 1;
            iVar47 = auVar41._8_4_ + in_XMM11._8_4_ >> 1;
            iVar48 = auVar41._12_4_ + in_XMM11._12_4_ >> 1;
            iVar30 = (int)(auVar49._0_4_ + uVar21 + (uint)auVar28._8_2_) >> 1;
            iVar35 = (int)(auVar32._10_2_ + uVar21 + (uint)auVar28._10_2_) >> 1;
            iVar36 = (int)(auVar32._12_2_ + uVar21 + (uint)auVar28._12_2_) >> 1;
            iVar37 = (int)(auVar32._14_2_ + uVar21 + (uint)auVar28._14_2_) >> 1;
          }
          else {
            in_XMM11 = pmulld(in_XMM11,auVar24);
            auVar32 = pmulld(auVar41,auVar25);
            iVar39 = auVar32._0_4_ + in_XMM11._0_4_ >> 4;
            iVar46 = auVar32._4_4_ + in_XMM11._4_4_ >> 4;
            iVar47 = auVar32._8_4_ + in_XMM11._8_4_ >> 4;
            iVar48 = auVar32._12_4_ + in_XMM11._12_4_ >> 4;
            auVar32._0_4_ = auVar28._8_2_ + uVar21;
            auVar32._4_4_ = auVar28._10_2_ + uVar21;
            auVar32._8_4_ = auVar28._12_2_ + uVar21;
            auVar32._12_4_ = auVar28._14_2_ + uVar21;
            auVar40 = pmulld(auVar49,auVar24);
            auVar28 = pmulld(auVar32,auVar25);
            iVar30 = auVar28._0_4_ + auVar40._0_4_ >> 4;
            iVar35 = auVar28._4_4_ + auVar40._4_4_ >> 4;
            iVar36 = auVar28._8_4_ + auVar40._8_4_ >> 4;
            iVar37 = auVar28._12_4_ + auVar40._12_4_ >> 4;
          }
          auVar40._0_4_ = (int)(iVar39 + (iVar27 - uVar21)) >> auVar23;
          auVar40._4_4_ = (int)(iVar46 + (iVar27 - uVar21)) >> auVar23;
          auVar40._8_4_ = (int)(iVar47 + (iVar27 - uVar21)) >> auVar23;
          auVar40._12_4_ = (int)(iVar48 + (iVar27 - uVar21)) >> auVar23;
          auVar28._0_4_ = (int)(iVar30 + (iVar27 - uVar21)) >> auVar23;
          auVar28._4_4_ = (int)(iVar35 + (iVar27 - uVar21)) >> auVar23;
          auVar28._8_4_ = (int)(iVar36 + (iVar27 - uVar21)) >> auVar23;
          auVar28._12_4_ = (int)(iVar37 + (iVar27 - uVar21)) >> auVar23;
          auVar28 = packusdw(auVar40,auVar28);
          sVar29 = auVar28._0_2_;
          in_XMM9._0_2_ = (ushort)(sVar3 < sVar29) * sVar3 | (ushort)(sVar3 >= sVar29) * sVar29;
          sVar29 = auVar28._2_2_;
          in_XMM9._2_2_ = (ushort)(sVar4 < sVar29) * sVar4 | (ushort)(sVar4 >= sVar29) * sVar29;
          sVar29 = auVar28._4_2_;
          in_XMM9._4_2_ = (ushort)(sVar3 < sVar29) * sVar3 | (ushort)(sVar3 >= sVar29) * sVar29;
          sVar29 = auVar28._6_2_;
          in_XMM9._6_2_ = (ushort)(sVar4 < sVar29) * sVar4 | (ushort)(sVar4 >= sVar29) * sVar29;
          sVar29 = auVar28._8_2_;
          in_XMM9._8_2_ = (ushort)(sVar3 < sVar29) * sVar3 | (ushort)(sVar3 >= sVar29) * sVar29;
          sVar29 = auVar28._10_2_;
          in_XMM9._10_2_ = (ushort)(sVar4 < sVar29) * sVar4 | (ushort)(sVar4 >= sVar29) * sVar29;
          sVar29 = auVar28._12_2_;
          sVar38 = auVar28._14_2_;
          in_XMM9._12_2_ = (ushort)(sVar3 < sVar29) * sVar3 | (ushort)(sVar3 >= sVar29) * sVar29;
          in_XMM9._14_2_ = (ushort)(sVar4 < sVar38) * sVar4 | (ushort)(sVar4 >= sVar38) * sVar38;
          puVar7 = dst0 + uVar20 * (long)dst_stride0;
        }
        *(undefined1 (*) [16])(puVar7 + lVar13) = in_XMM9;
      }
      src = src + src_stride;
      puVar17 = puVar17 + lVar11;
    }
  }
  else if ((w & 3U) == 0) {
    lVar13 = (long)src_stride;
    puVar17 = src + lVar13;
    puVar7 = puVar2;
    puVar18 = puVar2 + lVar11;
    for (lVar19 = 0; lVar19 < h; lVar19 = lVar19 + 2) {
      for (lVar14 = 0; lVar14 < w; lVar14 = lVar14 + 4) {
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)(puVar17 + lVar14);
        auVar42._8_8_ = *(ulong *)(puVar17 + lVar14);
        auVar42._0_8_ = *(undefined8 *)(src + lVar14);
        auVar28 = psllw(auVar42,auVar23);
        if (iVar10 == 0) {
          auVar44 = paddusw(auVar28,auVar26);
          puVar12 = puVar2;
          puVar22 = puVar2 + lVar11;
          lVar16 = lVar11;
        }
        else {
          in_XMM11 = pmovzxwd(in_XMM11,*(undefined8 *)(puVar7 + lVar14));
          in_XMM10 = pmovzxwd(in_XMM10,*(undefined8 *)(puVar18 + lVar14));
          auVar32 = pmovzxwd(auVar31,auVar28);
          auVar33._0_4_ = auVar32._0_4_ + uVar21;
          auVar33._4_4_ = auVar32._4_4_ + uVar21;
          auVar33._8_4_ = auVar32._8_4_ + uVar21;
          auVar33._12_4_ = auVar32._12_4_ + uVar21;
          auVar43._0_4_ = auVar28._8_2_ + uVar21;
          auVar43._4_4_ = auVar28._10_2_ + uVar21;
          auVar43._8_4_ = auVar28._12_2_ + uVar21;
          auVar43._12_4_ = auVar28._14_2_ + uVar21;
          if (iVar1 == 0) {
            iVar30 = auVar33._0_4_ + in_XMM11._0_4_ >> 1;
            iVar35 = auVar33._4_4_ + in_XMM11._4_4_ >> 1;
            iVar36 = auVar33._8_4_ + in_XMM11._8_4_ >> 1;
            iVar37 = auVar33._12_4_ + in_XMM11._12_4_ >> 1;
            iVar39 = auVar43._0_4_ + in_XMM10._0_4_ >> 1;
            iVar46 = auVar43._4_4_ + in_XMM10._4_4_ >> 1;
            iVar47 = auVar43._8_4_ + in_XMM10._8_4_ >> 1;
            iVar48 = auVar43._12_4_ + in_XMM10._12_4_ >> 1;
          }
          else {
            in_XMM11 = pmulld(in_XMM11,auVar24);
            auVar28 = pmulld(auVar33,auVar25);
            iVar30 = auVar28._0_4_ + in_XMM11._0_4_ >> 4;
            iVar35 = auVar28._4_4_ + in_XMM11._4_4_ >> 4;
            iVar36 = auVar28._8_4_ + in_XMM11._8_4_ >> 4;
            iVar37 = auVar28._12_4_ + in_XMM11._12_4_ >> 4;
            in_XMM10 = pmulld(in_XMM10,auVar24);
            auVar28 = pmulld(auVar43,auVar25);
            iVar39 = auVar28._0_4_ + in_XMM10._0_4_ >> 4;
            iVar46 = auVar28._4_4_ + in_XMM10._4_4_ >> 4;
            iVar47 = auVar28._8_4_ + in_XMM10._8_4_ >> 4;
            iVar48 = auVar28._12_4_ + in_XMM10._12_4_ >> 4;
          }
          auVar34._0_4_ = (int)(iVar30 + (iVar27 - uVar21)) >> auVar23;
          auVar34._4_4_ = (int)(iVar35 + (iVar27 - uVar21)) >> auVar23;
          auVar34._8_4_ = (int)(iVar36 + (iVar27 - uVar21)) >> auVar23;
          auVar34._12_4_ = (int)(iVar37 + (iVar27 - uVar21)) >> auVar23;
          auVar45._0_4_ = (int)(iVar39 + (iVar27 - uVar21)) >> auVar23;
          auVar45._4_4_ = (int)(iVar46 + (iVar27 - uVar21)) >> auVar23;
          auVar45._8_4_ = (int)(iVar47 + (iVar27 - uVar21)) >> auVar23;
          auVar45._12_4_ = (int)(iVar48 + (iVar27 - uVar21)) >> auVar23;
          auVar28 = packusdw(auVar34,auVar45);
          sVar29 = auVar28._0_2_;
          auVar44._0_2_ = (ushort)(sVar3 < sVar29) * sVar3 | (ushort)(sVar3 >= sVar29) * sVar29;
          sVar29 = auVar28._2_2_;
          auVar44._2_2_ = (ushort)(sVar4 < sVar29) * sVar4 | (ushort)(sVar4 >= sVar29) * sVar29;
          sVar29 = auVar28._4_2_;
          auVar44._4_2_ = (ushort)(sVar3 < sVar29) * sVar3 | (ushort)(sVar3 >= sVar29) * sVar29;
          sVar29 = auVar28._6_2_;
          auVar44._6_2_ = (ushort)(sVar4 < sVar29) * sVar4 | (ushort)(sVar4 >= sVar29) * sVar29;
          sVar29 = auVar28._8_2_;
          auVar44._8_2_ = (ushort)(sVar3 < sVar29) * sVar3 | (ushort)(sVar3 >= sVar29) * sVar29;
          sVar29 = auVar28._10_2_;
          auVar44._10_2_ = (ushort)(sVar4 < sVar29) * sVar4 | (ushort)(sVar4 >= sVar29) * sVar29;
          sVar29 = auVar28._12_2_;
          sVar38 = auVar28._14_2_;
          auVar44._12_2_ = (ushort)(sVar3 < sVar29) * sVar3 | (ushort)(sVar3 >= sVar29) * sVar29;
          auVar44._14_2_ = (ushort)(sVar4 < sVar38) * sVar4 | (ushort)(sVar4 >= sVar38) * sVar38;
          puVar12 = dst0;
          puVar22 = dst0 + dst_stride0;
          lVar16 = (long)dst_stride0;
        }
        lVar16 = lVar19 * lVar16 + lVar14;
        *(long *)(puVar12 + lVar16) = auVar44._0_8_;
        *(long *)(puVar22 + lVar16) = auVar44._8_8_;
      }
      puVar17 = puVar17 + lVar13 * 2;
      src = src + lVar13 * 2;
      puVar18 = puVar18 + lVar11 * 2;
      puVar7 = puVar7 + lVar11 * 2;
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_copy_sse4_1(const uint16_t *src,
                                                 int src_stride, uint16_t *dst0,
                                                 int dst_stride0, int w, int h,
                                                 ConvolveParams *conv_params,
                                                 int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;

  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i zero = _mm_setzero_si128();
  int i, j;

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const __m128i offset_const_16b = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits <= 4);

  if (!(w % 8)) {
    for (i = 0; i < h; i += 1) {
      for (j = 0; j < w; j += 8) {
        const __m128i src_16bit =
            _mm_loadu_si128((__m128i *)(&src[i * src_stride + j]));
        const __m128i res = _mm_sll_epi16(src_16bit, left_shift);
        if (do_average) {
          const __m128i data_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i data_ref_0_lo = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_0_hi = _mm_unpackhi_epi16(data_0, zero);

          const __m128i res_32b_lo = _mm_unpacklo_epi16(res, zero);
          const __m128i res_unsigned_lo =
              _mm_add_epi32(res_32b_lo, offset_const);

          const __m128i comp_avg_res_lo =
              highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i res_32b_hi = _mm_unpackhi_epi16(res, zero);
          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_32b_hi, offset_const);

          const __m128i comp_avg_res_hi =
              highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          const __m128i res_unsigned_16b =
              _mm_adds_epu16(res, offset_const_16b);

          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]),
                          res_unsigned_16b);
        }
      }
    }
  } else if (!(w % 4)) {
    for (i = 0; i < h; i += 2) {
      for (j = 0; j < w; j += 4) {
        const __m128i src_row_0 =
            _mm_loadl_epi64((__m128i *)(&src[i * src_stride + j]));
        const __m128i src_row_1 =
            _mm_loadl_epi64((__m128i *)(&src[i * src_stride + j + src_stride]));
        const __m128i src_10 = _mm_unpacklo_epi64(src_row_0, src_row_1);

        const __m128i res = _mm_sll_epi16(src_10, left_shift);

        if (do_average) {
          const __m128i data_0 =
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_1 = _mm_loadl_epi64(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride]));

          const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_1 = _mm_unpacklo_epi16(data_1, zero);

          const __m128i res_32b = _mm_unpacklo_epi16(res, zero);
          const __m128i res_unsigned_lo = _mm_add_epi32(res_32b, offset_const);

          const __m128i res_32b_hi = _mm_unpackhi_epi16(res, zero);
          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_32b_hi, offset_const);

          const __m128i comp_avg_res_lo = highbd_comp_avg_sse4_1(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);
          const __m128i comp_avg_res_hi = highbd_comp_avg_sse4_1(
              &data_ref_1, &res_unsigned_hi, &wt0, &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_1 = _mm_srli_si128(res_clip, 8);

          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          _mm_storel_epi64(
              (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
        } else {
          const __m128i res_unsigned_16b =
              _mm_adds_epu16(res, offset_const_16b);

          const __m128i res_1 = _mm_srli_si128(res_unsigned_16b, 8);

          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]),
                           res_unsigned_16b);
          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                           res_1);
        }
      }
    }
  }
}